

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O3

bool CheckCollapsePath(string *path,string *expected)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  string result;
  string local_40;
  
  cmsys::SystemTools::CollapseFullPath(&local_40,path);
  _Var4._M_p = local_40._M_dataplus._M_p;
  __n = expected->_M_string_length;
  if (__n == local_40._M_string_length) {
    bVar3 = true;
    if (__n == 0) goto LAB_0011cd6c;
    iVar1 = bcmp((expected->_M_dataplus)._M_p,local_40._M_dataplus._M_p,__n);
    if (iVar1 == 0) goto LAB_0011cd6c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"CollapseFullPath(",0x11)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")  yielded ",0xb);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," instead of ",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(expected->_M_dataplus)._M_p,expected->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  bVar3 = false;
  _Var4._M_p = local_40._M_dataplus._M_p;
LAB_0011cd6c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != &local_40.field_2) {
    operator_delete(_Var4._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

static bool CheckCollapsePath(
  const kwsys_stl::string& path,
  const kwsys_stl::string& expected)
{
  kwsys_stl::string result = kwsys::SystemTools::CollapseFullPath(path);
  if(expected != result)
    {
    kwsys_ios::cerr << "CollapseFullPath(" << path
      << ")  yielded " << result << " instead of " << expected << kwsys_ios::endl;
    return false;
    }
  return true;
}